

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O1

void Abc_NtkDelayTraceSortPins(Abc_Obj_t *pNode,int *pPinPerm,float *pPinDelays)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  void **ppvVar4;
  long *plVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (0 < (pNode->vFanins).nSize) {
    piVar3 = (pNode->vFanins).pArray;
    ppvVar4 = pNode->pNtk->vObjs->pArray;
    lVar11 = 0;
    do {
      plVar5 = (long *)ppvVar4[piVar3[lVar11]];
      pPinPerm[lVar11] = (int)lVar11;
      pPinDelays[lVar11] = *(float *)(*(long *)(*plVar5 + 400) + (long)(int)plVar5[2] * 0xc);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (pNode->vFanins).nSize);
  }
  uVar7 = (pNode->vFanins).nSize;
  uVar8 = (ulong)uVar7;
  if (1 < (int)uVar7) {
    uVar9 = 1;
    uVar12 = 0;
    do {
      uVar1 = uVar12 + 1;
      uVar10 = uVar12 & 0xffffffff;
      if ((long)uVar1 < (long)(int)uVar8) {
        uVar10 = uVar12 & 0xffffffff;
        uVar13 = uVar9;
        do {
          uVar6 = uVar13 & 0xffffffff;
          if (pPinDelays[pPinPerm[uVar13]] < pPinDelays[pPinPerm[(int)uVar10]] ||
              pPinDelays[pPinPerm[uVar13]] == pPinDelays[pPinPerm[(int)uVar10]]) {
            uVar6 = uVar10;
          }
          uVar10 = uVar6;
          uVar13 = uVar13 + 1;
        } while ((uVar8 & 0xffffffff) != uVar13);
      }
      if (uVar12 != uVar10) {
        iVar2 = pPinPerm[uVar12];
        pPinPerm[uVar12] = pPinPerm[(int)uVar10];
        pPinPerm[(int)uVar10] = iVar2;
      }
      uVar7 = (pNode->vFanins).nSize;
      uVar8 = (ulong)(int)uVar7;
      uVar9 = uVar9 + 1;
      uVar12 = uVar1;
    } while ((long)uVar1 < (long)(uVar8 - 1));
  }
  if ((uVar7 != 0) && ((int)uVar7 <= *pPinPerm)) {
    __assert_fail("Abc_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Abc_ObjFaninNum(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                  ,0x51,"void Abc_NtkDelayTraceSortPins(Abc_Obj_t *, int *, float *)");
  }
  if (1 < (int)uVar7) {
    uVar8 = 1;
    do {
      if ((int)uVar7 <= pPinPerm[uVar8]) {
        __assert_fail("pPinPerm[i] < Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                      ,0x54,"void Abc_NtkDelayTraceSortPins(Abc_Obj_t *, int *, float *)");
      }
      if (pPinDelays[pPinPerm[uVar8 - 1]] < pPinDelays[pPinPerm[uVar8]]) {
        __assert_fail("pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                      ,0x55,"void Abc_NtkDelayTraceSortPins(Abc_Obj_t *, int *, float *)");
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return;
}

Assistant:

void Abc_NtkDelayTraceSortPins( Abc_Obj_t * pNode, int * pPinPerm, float * pPinDelays )
{
    Abc_Obj_t * pFanin;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Abc_ObjArrival(pFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Abc_ObjFaninNum(pNode)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Abc_ObjFaninNum(pNode); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Abc_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Abc_ObjFaninNum(pNode) );
    for ( i = 1; i < Abc_ObjFaninNum(pNode); i++ )
    {
        assert( pPinPerm[i] < Abc_ObjFaninNum(pNode) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}